

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

void t3strlwr(char *p)

{
  byte bVar1;
  byte *pbVar3;
  int iVar2;
  
  bVar1 = *p;
  if (bVar1 != 0) {
    pbVar3 = (byte *)(p + 1);
    do {
      if (-1 < (char)bVar1) {
        iVar2 = tolower((uint)bVar1);
        bVar1 = (byte)iVar2;
      }
      pbVar3[-1] = bVar1;
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
  }
  return;
}

Assistant:

void t3strlwr(char *p)
{
    for ( ; *p != '\0' ; ++p)
        *p = (char)to_lower(*p);
}